

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Value.h
# Opt level: O0

void __thiscall String::~String(String *this)

{
  Value *in_RDI;
  
  in_RDI->_vptr_Value = (_func_int **)&PTR__String_002b1f28;
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  Value::~Value(in_RDI);
  return;
}

Assistant:

String(const std::string& value): Value(TypeName::String), value_(value) {}